

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::CatchScopeWalker::FindPropertyAddress(CatchScopeWalker *this,PropertyId _propId,bool *isConst)

{
  int iVar1;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  Type *pTVar3;
  int local_34;
  int i;
  Type properties;
  IDiagObjectAddress *address;
  bool *isConst_local;
  PropertyId _propId_local;
  CatchScopeWalker *this_local;
  
  *isConst = false;
  properties.ptr =
       (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr((WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                     *)&stack0xffffffffffffffd0,&this->debuggerScope->scopeProperties);
  local_34 = 0;
  while( true ) {
    pLVar2 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->((WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                           *)&stack0xffffffffffffffd0);
    iVar1 = JsUtil::ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>::
            Count(&pLVar2->
                   super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>)
    ;
    if (iVar1 <= local_34) {
      return (IDiagObjectAddress *)properties.ptr;
    }
    pLVar2 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->((WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                           *)&stack0xffffffffffffffd0);
    pTVar3 = JsUtil::
             List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(pLVar2,local_34);
    if (pTVar3->propId == _propId) break;
    local_34 = local_34 + 1;
  }
  pLVar2 = Memory::
           WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           ::operator->((WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                         *)&stack0xffffffffffffffd0);
  pTVar3 = JsUtil::
           List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(pLVar2,local_34);
  FetchValueAndAddress(this,pTVar3,(Var *)0x0,(IDiagObjectAddress **)&properties);
  return (IDiagObjectAddress *)properties.ptr;
}

Assistant:

IDiagObjectAddress *CatchScopeWalker::FindPropertyAddress(PropertyId _propId, bool& isConst)
    {
        isConst = false;
        IDiagObjectAddress * address = nullptr;
        auto properties = debuggerScope->scopeProperties;
        for (int i = 0; i < properties->Count(); i++)
        {
            if (properties->Item(i).propId == _propId)
            {
                FetchValueAndAddress(properties->Item(i), nullptr, &address);
                break;
            }
        }

        return address;
    }